

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

int lws_state_transition_steps(lws_state_manager_t *mgr,int target)

{
  uint uVar1;
  int iVar2;
  char *str;
  char *str_00;
  char temp8 [8];
  char local_20 [8];
  
  uVar1 = mgr->state;
  do {
    if (mgr->state == target) break;
    iVar2 = _lws_state_transition(mgr,mgr->state + 1);
  } while (iVar2 == 0);
  if (mgr->state_names == (char **)0x0) {
    str = local_20;
    lws_snprintf(str,8,"%d",(ulong)uVar1);
  }
  else {
    str = mgr->state_names[(int)uVar1];
  }
  if (mgr->state_names == (char **)0x0) {
    str_00 = local_20;
    lws_snprintf(str_00,8,"%d");
  }
  else {
    str_00 = mgr->state_names[mgr->state];
  }
  _lws_log(8,"%s: %s -> %s\n","lws_state_transition_steps",str,str_00);
  return 0;
}

Assistant:

int
lws_state_transition_steps(lws_state_manager_t *mgr, int target)
{
	int n = 0;
#if defined(_DEBUG)
	int i = mgr->state;
	char temp8[8];
#endif

	while (!n && mgr->state != target)
		n = _lws_state_transition(mgr, mgr->state + 1);

#if defined(_DEBUG)
	lwsl_info("%s: %s -> %s\n", __func__, _systnm(mgr, i, temp8),
			_systnm(mgr, mgr->state, temp8));
#endif

	return 0;
}